

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O0

void __thiscall
mvm::
interpreter<mvm::test::test_instr_set_mixed,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<double,unsigned_int>>>>>
::
produce<mvm::value_stack<mvm::list::mplist<double,unsigned_int>>,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
          (interpreter<mvm::test::test_instr_set_mixed,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<double,unsigned_int>>>>>
           *this,vector<double,_std::allocator<double>_> *arg)

{
  bool bVar1;
  reference pdVar2;
  value_stack<mvm::list::mplist<double,_unsigned_int>_> *this_00;
  double local_38;
  double sub;
  iterator __end0;
  iterator __begin0;
  vector<double,_std::allocator<double>_> *__range4;
  vector<double,_std::allocator<double>_> *arg_local;
  interpreter<mvm::test::test_instr_set_mixed,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>_>_>_>
  *this_local;
  
  __end0 = std::vector<double,_std::allocator<double>_>::begin(arg);
  sub = (double)std::vector<double,_std::allocator<double>_>::end(arg);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&sub);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end0);
    local_38 = *pdVar2;
    this_00 = std::
              get<mvm::value_stack<mvm::list::mplist<double,unsigned_int>>,mvm::bytecode_serializer,mvm::value_stack<mvm::list::mplist<double,unsigned_int>>>
                        ((tuple<mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>_>
                          *)(this + 8));
    value_stack<mvm::list::mplist<double,_unsigned_int>_>::push<double>(this_00,&local_38);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end0);
  }
  return;
}

Assistant:

void interpreter<Set, InstancesList>::produce(T &&arg) {
  if constexpr (concept ::is_tuple_v<std::decay_t<T>>) {
    this->produce_unroll<IS>(
        std::forward<T>(arg),
        std::make_index_sequence<std::tuple_size<T>::value>());
  } else if constexpr (concept ::is_container_valid_v<std::decay_t<T>>) {
    for (auto sub : std::forward<T>(arg)) {
      std::get<IS>(m_instances)
          .template push<typename V::value_type>(std::move(sub));
    }
  } else {
    std::get<IS>(m_instances).template push<V>(std::forward<T>(arg));
  }
}